

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu540c.c
# Opt level: O1

MPP_RET hal_jpege_v540c_get_task(void *hal,HalEncTask *task)

{
  MppFrame frame;
  EncRcTask *pEVar1;
  void *__src;
  RK_S32 RVar2;
  MppMeta meta;
  
  frame = task->frame;
  pEVar1 = task->rc_task;
  __src = (task->syntax).data;
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) enter\n","hal_jpege_v540c_get_task",0x17b);
  }
  memcpy((void *)((long)hal + 0xe8),__src,0xb8);
  *(undefined4 *)((long)hal + 0x8c) = *(undefined4 *)((long)hal + 0x88);
  if (((pEVar1->frm).val & 0x400000000) == 0) {
    RVar2 = mpp_frame_has_meta(task->frame);
    if (RVar2 != 0) {
      meta = mpp_frame_get_meta(frame);
      mpp_meta_get_ptr(meta,KEY_ROI_DATA,(void **)((long)hal + 0x98));
    }
  }
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) leave\n","hal_jpege_v540c_get_task",0x187);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_v540c_get_task(void *hal, HalEncTask *task)
{
    jpegeV540cHalContext *ctx = (jpegeV540cHalContext *)hal;
    MppFrame frame = task->frame;
    EncFrmStatus  *frm_status = &task->rc_task->frm;
    JpegeSyntax *syntax = (JpegeSyntax *)task->syntax.data;

    hal_jpege_enter();

    memcpy(&ctx->syntax, syntax, sizeof(ctx->syntax));

    ctx->last_frame_type = ctx->frame_type;

    if (!frm_status->reencode && mpp_frame_has_meta(task->frame)) {
        MppMeta meta = mpp_frame_get_meta(frame);

        mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void **)&ctx->roi_data);
    }

    hal_jpege_leave();
    return MPP_OK;
}